

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

Span * tcmalloc::NewSpan(uint64_t page_id,uint64_t npages)

{
  Span *__s;
  Span *span;
  uint64_t npages_local;
  uint64_t page_id_local;
  
  __s = FixedAllocator<tcmalloc::Span>::Alloc((FixedAllocator<tcmalloc::Span> *)span_allocator);
  memset(__s,0,8);
  __s->page_id = page_id;
  __s->npages = npages;
  __s->refcount = 0;
  return __s;
}

Assistant:

Span* NewSpan(uint64_t page_id, uint64_t npages) {
    Span* span = span_allocator.Alloc();
    memset(span, 0, sizeof(span));
    span->page_id = page_id;
    span->npages = npages;
    span->refcount = 0;
    return span;
}